

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O2

void __thiscall Sandbox::_updateBuffers(Sandbox *this)

{
  ShaderList *pSVar1;
  FboList *this_00;
  FloodList *this_01;
  pointer ppFVar2;
  pointer ppFVar3;
  pointer ppPVar4;
  pointer ppPVar5;
  long *plVar6;
  pointer pPVar7;
  pointer pFVar8;
  pointer pFVar9;
  string *psVar10;
  undefined1 auVar11 [8];
  bool bVar12;
  int iVar13;
  int _height;
  PingPong *pPVar14;
  ostream *poVar15;
  DefaultShaders _type;
  DefaultShaders _type_00;
  DefaultShaders _type_01;
  DefaultShaders _type_02;
  DefaultShaders _type_03;
  DefaultShaders _type_04;
  DefaultShaders _type_05;
  DefaultShaders _type_06;
  DefaultShaders _type_07;
  DefaultShaders _type_08;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  size_t i;
  ulong uVar16;
  size_t i_2;
  pointer pSVar17;
  long lVar18;
  size_t i_1;
  long lVar19;
  size_t i_7;
  Shader *pSVar20;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  vec3 vVar21;
  allocator local_641;
  ulong local_640;
  string *local_638;
  Uniforms *local_630;
  string local_628;
  undefined1 local_608 [16];
  int local_5f8 [8];
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5c8 [16];
  Pyramid local_5b8;
  
  if (this->m_buffers_total ==
      (int)((ulong)((long)(this->uniforms).buffers.
                          super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).buffers.
                         super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    lVar19 = 0;
    for (uVar16 = 0;
        pSVar17 = (this->m_buffers_shaders).
                  super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar16 < (ulong)((long)(this->m_buffers_shaders).
                               super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pSVar17 >> 8);
        uVar16 = uVar16 + 1) {
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,(DefaultShaders)in_RDX);
      vera::Shader::setSource
                ((Shader *)((long)&(pSVar17->super_HaveDefines)._vptr_HaveDefines + lVar19),
                 &this->m_frag_source,(string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_5b8);
      lVar19 = lVar19 + 0x100;
      in_RDX = extraout_RDX;
    }
  }
  else {
    if (this->verbose == true) {
      poVar15 = std::operator<<((ostream *)&std::cout,"Creating/removing ");
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      poVar15 = std::operator<<(poVar15," buffers to match ");
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->m_buffers_total);
      std::endl<char,std::char_traits<char>>(poVar15);
    }
    local_638 = (string *)&(this->uniforms).buffers;
    pSVar1 = &this->m_buffers_shaders;
    lVar19 = 0;
    for (uVar16 = 0;
        pSVar17 = (this->m_buffers_shaders).
                  super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar16 < (ulong)((long)(this->m_buffers_shaders).
                               super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pSVar17 >> 8);
        uVar16 = uVar16 + 1) {
      bVar12 = vera::Shader::isLoaded
                         ((Shader *)((long)&(pSVar17->super_HaveDefines)._vptr_HaveDefines + lVar19)
                         );
      if (bVar12) {
        vera::Shader::detach
                  ((Shader *)
                   ((long)&(((pSVar1->
                             super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>).
                             _M_impl.super__Vector_impl_data._M_start)->super_HaveDefines).
                           _vptr_HaveDefines + lVar19),0x8b31);
      }
      lVar19 = lVar19 + 0x100;
    }
    uVar16 = 0;
    while( true ) {
      ppFVar2 = (this->uniforms).buffers.
                super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppFVar3 = (this->uniforms).buffers.
                super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)((long)ppFVar3 - (long)ppFVar2 >> 3) <= uVar16) break;
      if (ppFVar2[uVar16] != (Fbo *)0x0) {
        (*ppFVar2[uVar16]->_vptr_Fbo[1])();
      }
      uVar16 = uVar16 + 1;
    }
    if (ppFVar3 != ppFVar2) {
      (this->uniforms).buffers.super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl
      .super__Vector_impl_data._M_finish = ppFVar2;
    }
    local_5d8 = (undefined1  [8])pSVar1;
    std::vector<vera::Shader,_std::allocator<vera::Shader>_>::clear(pSVar1);
    local_608._0_8_ = &this->m_frag_source;
    iVar13 = 0;
    in_RDX = extraout_RDX_00;
    while (local_640 = CONCAT44(local_640._4_4_,iVar13), iVar13 < this->m_buffers_total) {
      pPVar14 = (PingPong *)operator_new(0x38);
      vera::Fbo::Fbo((Fbo *)pPVar14);
      local_5b8._vptr_Pyramid = (_func_int **)pPVar14;
      std::vector<vera::Fbo*,std::allocator<vera::Fbo*>>::emplace_back<vera::Fbo*>
                ((vector<vera::Fbo*,std::allocator<vera::Fbo*>> *)local_638,(Fbo **)&local_5b8);
      vera::toString<int>(&local_628,(int *)&local_640);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5b8
                     ,"u_buffer",&local_628);
      vVar21 = getBufferSize((string *)local_608._0_8_,(string *)&local_5b8);
      local_5c8._8_4_ = extraout_XMM0_Dc;
      local_5c8._0_8_ = vVar21._0_8_;
      local_5c8._12_4_ = extraout_XMM0_Dd;
      local_630 = (Uniforms *)CONCAT44(local_630._4_4_,vVar21.field_2);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_628);
      psVar10 = local_638;
      plVar6 = *(long **)(*(long *)local_638 + (long)(int)local_640 * 8);
      (**(code **)(*plVar6 + 0x10))
                (plVar6,(long)(float)local_5c8._0_4_,(long)(float)local_5c8._4_4_,2,0,0,1);
      *(undefined4 *)(*(long *)(*(long *)psVar10 + (long)(int)local_640 * 8) + 8) = local_630._0_4_;
      vera::Shader::Shader((Shader *)&local_5b8);
      auVar11 = local_5d8;
      std::vector<vera::Shader,_std::allocator<vera::Shader>_>::emplace_back<vera::Shader>
                ((vector<vera::Shader,_std::allocator<vera::Shader>_> *)local_5d8,
                 (Shader *)&local_5b8);
      vera::Shader::~Shader((Shader *)&local_5b8);
      pSVar17 = (((_Vector_base<vera::Shader,_std::allocator<vera::Shader>_> *)auVar11)->_M_impl).
                super__Vector_impl_data._M_start + (int)local_640;
      vera::toString<int>(&local_628,(int *)&local_640);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5b8
                     ,"BUFFER_",&local_628);
      std::__cxx11::string::string((string *)local_5f8,"",&local_641);
      (*(pSVar17->super_HaveDefines)._vptr_HaveDefines[10])(pSVar17,&local_5b8,(string *)local_5f8);
      std::__cxx11::string::~string((string *)local_5f8);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_628);
      lVar18 = (long)(int)local_640;
      lVar19 = *(long *)local_5d8;
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,_type);
      vera::Shader::setSource
                ((Shader *)(lVar18 * 0x100 + lVar19),(string *)local_608._0_8_,(string *)&local_5b8)
      ;
      std::__cxx11::string::~string((string *)&local_5b8);
      in_RDX = extraout_RDX_01;
      iVar13 = (int)local_640 + 1;
    }
  }
  if (this->m_doubleBuffers_total ==
      (int)((ulong)((long)(this->uniforms).doubleBuffers.
                          super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).doubleBuffers.
                         super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar19 = 0;
    for (uVar16 = 0;
        pSVar17 = (this->m_doubleBuffers_shaders).
                  super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar16 < (ulong)((long)(this->m_doubleBuffers_shaders).
                               super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pSVar17 >> 8);
        uVar16 = uVar16 + 1) {
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,(DefaultShaders)in_RDX);
      vera::Shader::setSource
                ((Shader *)((long)&(pSVar17->super_HaveDefines)._vptr_HaveDefines + lVar19),
                 &this->m_frag_source,(string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_5b8);
      lVar19 = lVar19 + 0x100;
      in_RDX = extraout_RDX_02;
    }
  }
  else {
    if (this->verbose == true) {
      poVar15 = std::operator<<((ostream *)&std::cout,"Creating/removing ");
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      poVar15 = std::operator<<(poVar15," double buffers to match ");
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->m_doubleBuffers_total);
      std::endl<char,std::char_traits<char>>(poVar15);
    }
    local_638 = (string *)&(this->uniforms).doubleBuffers;
    pSVar1 = &this->m_doubleBuffers_shaders;
    lVar19 = 0;
    for (uVar16 = 0;
        pSVar17 = (this->m_doubleBuffers_shaders).
                  super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar16 < (ulong)((long)(this->m_doubleBuffers_shaders).
                               super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pSVar17 >> 8);
        uVar16 = uVar16 + 1) {
      bVar12 = vera::Shader::isLoaded
                         ((Shader *)((long)&(pSVar17->super_HaveDefines)._vptr_HaveDefines + lVar19)
                         );
      if (bVar12) {
        vera::Shader::detach
                  ((Shader *)
                   ((long)&(((pSVar1->
                             super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>).
                             _M_impl.super__Vector_impl_data._M_start)->super_HaveDefines).
                           _vptr_HaveDefines + lVar19),0x8b31);
      }
      lVar19 = lVar19 + 0x100;
    }
    uVar16 = 0;
    while( true ) {
      ppPVar4 = (this->uniforms).doubleBuffers.
                super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppPVar5 = (this->uniforms).doubleBuffers.
                super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)((long)ppPVar5 - (long)ppPVar4 >> 3) <= uVar16) break;
      if (ppPVar4[uVar16] != (PingPong *)0x0) {
        (*ppPVar4[uVar16]->_vptr_PingPong[1])();
      }
      uVar16 = uVar16 + 1;
    }
    if (ppPVar5 != ppPVar4) {
      (this->uniforms).doubleBuffers.
      super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppPVar4;
    }
    local_5d8 = (undefined1  [8])pSVar1;
    std::vector<vera::Shader,_std::allocator<vera::Shader>_>::clear(pSVar1);
    local_608._0_8_ = &this->m_frag_source;
    iVar13 = 0;
    while (local_640 = CONCAT44(local_640._4_4_,iVar13), iVar13 < this->m_doubleBuffers_total) {
      pPVar14 = (PingPong *)operator_new(0x90);
      vera::PingPong::PingPong(pPVar14);
      local_5b8._vptr_Pyramid = (_func_int **)pPVar14;
      std::vector<vera::PingPong*,std::allocator<vera::PingPong*>>::emplace_back<vera::PingPong*>
                ((vector<vera::PingPong*,std::allocator<vera::PingPong*>> *)local_638,
                 (PingPong **)&local_5b8);
      vera::toString<int>(&local_628,(int *)&local_640);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5b8
                     ,"u_doubleBuffer",&local_628);
      vVar21 = getBufferSize((string *)local_608._0_8_,(string *)&local_5b8);
      local_5c8._8_4_ = extraout_XMM0_Dc_00;
      local_5c8._0_8_ = vVar21._0_8_;
      local_5c8._12_4_ = extraout_XMM0_Dd_00;
      local_630 = (Uniforms *)CONCAT44(local_630._4_4_,vVar21.field_2);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_628);
      psVar10 = local_638;
      plVar6 = *(long **)(*(long *)local_638 + (long)(int)local_640 * 8);
      (**(code **)(*plVar6 + 0x10))
                (plVar6,(int)(float)local_5c8._0_4_,(int)(float)local_5c8._4_4_,2,0,0,1);
      lVar19 = *(long *)(*(long *)psVar10 + (long)(int)local_640 * 8);
      *(undefined4 *)(lVar19 + 0x20) = local_630._0_4_;
      *(undefined4 *)(lVar19 + 0x58) = local_630._0_4_;
      vera::Shader::Shader((Shader *)&local_5b8);
      auVar11 = local_5d8;
      std::vector<vera::Shader,_std::allocator<vera::Shader>_>::emplace_back<vera::Shader>
                ((vector<vera::Shader,_std::allocator<vera::Shader>_> *)local_5d8,
                 (Shader *)&local_5b8);
      vera::Shader::~Shader((Shader *)&local_5b8);
      pSVar17 = (((_Vector_base<vera::Shader,_std::allocator<vera::Shader>_> *)auVar11)->_M_impl).
                super__Vector_impl_data._M_start + (int)local_640;
      vera::toString<int>(&local_628,(int *)&local_640);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5b8
                     ,"DOUBLE_BUFFER_",&local_628);
      std::__cxx11::string::string((string *)local_5f8,"",&local_641);
      (*(pSVar17->super_HaveDefines)._vptr_HaveDefines[10])(pSVar17,&local_5b8,(string *)local_5f8);
      std::__cxx11::string::~string((string *)local_5f8);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_628);
      lVar18 = (long)(int)local_640;
      lVar19 = *(long *)local_5d8;
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,_type_00);
      vera::Shader::setSource
                ((Shader *)(lVar18 * 0x100 + lVar19),(string *)local_608._0_8_,(string *)&local_5b8)
      ;
      std::__cxx11::string::~string((string *)&local_5b8);
      iVar13 = (int)local_640 + 1;
    }
  }
  iVar13 = this->m_pyramid_total;
  if (iVar13 != (int)(((long)(this->uniforms).pyramids.
                             super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->uniforms).pyramids.
                            super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x580)) {
    if (this->verbose == true) {
      poVar15 = std::operator<<((ostream *)&std::cout,"Removing ");
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      poVar15 = std::operator<<(poVar15," pyramids to create  ");
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->m_pyramid_total);
      std::endl<char,std::char_traits<char>>(poVar15);
    }
    local_630 = (Uniforms *)&(this->uniforms).pyramids;
    pSVar1 = &this->m_pyramid_subshaders;
    lVar19 = 0;
    for (uVar16 = 0;
        pSVar17 = (this->m_pyramid_subshaders).
                  super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar16 < (ulong)((long)(this->m_pyramid_subshaders).
                               super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pSVar17 >> 8);
        uVar16 = uVar16 + 1) {
      bVar12 = vera::Shader::isLoaded
                         ((Shader *)((long)&(pSVar17->super_HaveDefines)._vptr_HaveDefines + lVar19)
                         );
      if (bVar12) {
        vera::Shader::detach
                  ((Shader *)
                   ((long)&(((pSVar1->
                             super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>).
                             _M_impl.super__Vector_impl_data._M_start)->super_HaveDefines).
                           _vptr_HaveDefines + lVar19),0x8b31);
      }
      lVar19 = lVar19 + 0x100;
    }
    std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::clear
              ((vector<vera::Pyramid,_std::allocator<vera::Pyramid>_> *)local_630);
    this_00 = &this->m_pyramid_fbos;
    std::vector<vera::Fbo,_std::allocator<vera::Fbo>_>::clear(this_00);
    std::vector<vera::Shader,_std::allocator<vera::Shader>_>::clear(pSVar1);
    local_5f8[0] = 0;
    while( true ) {
      iVar13 = this->m_pyramid_total;
      if (iVar13 <= local_5f8[0]) break;
      vera::toString<int>(&local_628,local_5f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5b8
                     ,"u_pyramid",&local_628);
      vVar21 = getBufferSize(&this->m_frag_source,(string *)&local_5b8);
      local_608._8_4_ = extraout_XMM0_Dc_01;
      local_608._0_8_ = vVar21._0_8_;
      local_608._12_4_ = extraout_XMM0_Dd_01;
      local_638 = (string *)CONCAT44(local_638._4_4_,vVar21.field_2);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_628);
      vera::Shader::Shader((Shader *)&local_5b8);
      std::vector<vera::Shader,_std::allocator<vera::Shader>_>::emplace_back<vera::Shader>
                (pSVar1,(Shader *)&local_5b8);
      vera::Shader::~Shader((Shader *)&local_5b8);
      vera::Pyramid::Pyramid(&local_5b8);
      std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::emplace_back<vera::Pyramid>
                ((vector<vera::Pyramid,_std::allocator<vera::Pyramid>_> *)local_630,&local_5b8);
      vera::Pyramid::~Pyramid(&local_5b8);
      local_5d8._4_4_ = local_608._4_4_;
      local_5d8._0_4_ = local_608._4_4_;
      fStack_5d0 = (float)local_608._4_4_;
      fStack_5cc = (float)local_608._4_4_;
      vera::Pyramid::allocate
                ((this->uniforms).pyramids.
                 super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                 super__Vector_impl_data._M_start + local_5f8[0],(int)(float)local_608._0_4_,
                 (int)(float)local_608._4_4_);
      lVar19 = (long)local_5f8[0];
      pPVar7 = (this->uniforms).pyramids.
               super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar7[lVar19].scale = local_638._0_4_;
      local_628._M_string_length = 0;
      local_5b8._vptr_Pyramid = *(_func_int ***)&pPVar7[lVar19].pass.super__Function_base._M_functor
      ;
      local_5b8.pass.super__Function_base._M_functor._M_unused._0_8_ =
           (undefined8)
           *(undefined8 *)((long)&pPVar7[lVar19].pass.super__Function_base._M_functor + 8);
      *(Sandbox **)&pPVar7[lVar19].pass.super__Function_base._M_functor = this;
      *(undefined8 *)((long)&pPVar7[lVar19].pass.super__Function_base._M_functor + 8) = 0;
      local_5b8.pass.super__Function_base._M_functor._8_8_ =
           pPVar7[lVar19].pass.super__Function_base._M_manager;
      pPVar7[lVar19].pass.super__Function_base._M_manager =
           std::
           _Function_handler<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:1468:41)>
           ::_M_manager;
      local_5b8.pass.super__Function_base._M_manager = (_Manager_type)pPVar7[lVar19].pass._M_invoker
      ;
      pPVar7[lVar19].pass._M_invoker =
           std::
           _Function_handler<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:1468:41)>
           ::_M_invoke;
      local_628._M_dataplus._M_p = (pointer)this;
      std::_Function_base::~_Function_base((_Function_base *)&local_5b8);
      vera::Fbo::Fbo((Fbo *)&local_5b8);
      std::vector<vera::Fbo,_std::allocator<vera::Fbo>_>::emplace_back<vera::Fbo>
                (this_00,(Fbo *)&local_5b8);
      vera::Fbo::~Fbo((Fbo *)&local_5b8);
      pFVar8 = (this_00->super__Vector_base<vera::Fbo,_std::allocator<vera::Fbo>_>)._M_impl.
               super__Vector_impl_data._M_start;
      (*pFVar8[local_5f8[0]]._vptr_Fbo[2])
                (pFVar8 + local_5f8[0],(long)(float)local_608._0_4_,(long)(float)local_5d8._0_4_,2,0
                 ,0,1);
      (this_00->super__Vector_base<vera::Fbo,_std::allocator<vera::Fbo>_>)._M_impl.
      super__Vector_impl_data._M_start[local_5f8[0]].scale = local_638._0_4_;
      local_5f8[0] = local_5f8[0] + 1;
    }
  }
  if (0 < iVar13) {
    bVar12 = checkPyramidAlgorithm(&this->m_frag_source);
    if (bVar12) {
      std::__cxx11::string::string((string *)&local_5b8,"PYRAMID_ALGORITHM",(allocator *)local_5f8);
      std::__cxx11::string::string((string *)&local_628,"",(allocator *)&local_640);
      vera::HaveDefines::addDefine
                (&(this->m_pyramid_shader).super_HaveDefines,(string *)&local_5b8,&local_628);
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::string::~string((string *)&local_5b8);
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,_type_02);
      vera::Shader::setSource(&this->m_pyramid_shader,&this->m_frag_source,(string *)&local_5b8);
    }
    else {
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x16,_type_01);
      vera::getDefaultSrc_abi_cxx11_(&local_628,(vera *)0x5,_type_03);
      vera::Shader::setSource(&this->m_pyramid_shader,(string *)&local_5b8,&local_628);
      std::__cxx11::string::~string((string *)&local_628);
    }
    std::__cxx11::string::~string((string *)&local_5b8);
  }
  local_630 = &this->uniforms;
  local_638 = &this->m_frag_source;
  uVar16 = 0;
  while( true ) {
    pSVar17 = (this->m_pyramid_subshaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_640 = uVar16;
    if ((ulong)((long)(this->m_pyramid_subshaders).
                      super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pSVar17 >> 8) <= uVar16) break;
    vera::toString<unsigned_long>(&local_628,&local_640);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5b8,
                   "PYRAMID_",&local_628);
    std::__cxx11::string::string((string *)local_5f8,"",&local_641);
    pSVar17 = pSVar17 + uVar16;
    (*(pSVar17->super_HaveDefines)._vptr_HaveDefines[10])(pSVar17,&local_5b8,(string *)local_5f8);
    std::__cxx11::string::~string((string *)local_5f8);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_628);
    pSVar20 = (this->m_pyramid_subshaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start + local_640;
    vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,_type_04);
    vera::Shader::setSource(pSVar20,local_638,(string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_5b8);
    uVar16 = local_640 + 1;
  }
  iVar13 = this->m_flood_total;
  if (iVar13 != (int)(((long)(this->uniforms).floods.
                             super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->uniforms).floods.
                            super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0xc0)) {
    if (this->verbose == true) {
      poVar15 = std::operator<<((ostream *)&std::cout,"Removing ");
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      poVar15 = std::operator<<(poVar15," flood to create ");
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->m_flood_total);
      std::endl<char,std::char_traits<char>>(poVar15);
    }
    this_01 = &(this->uniforms).floods;
    pSVar1 = &this->m_flood_subshaders;
    lVar19 = 0;
    for (uVar16 = 0;
        pSVar17 = (this->m_flood_subshaders).
                  super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar16 < (ulong)((long)(this->m_flood_subshaders).
                               super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pSVar17 >> 8);
        uVar16 = uVar16 + 1) {
      bVar12 = vera::Shader::isLoaded
                         ((Shader *)((long)&(pSVar17->super_HaveDefines)._vptr_HaveDefines + lVar19)
                         );
      if (bVar12) {
        vera::Shader::detach
                  ((Shader *)
                   ((long)&(((pSVar1->
                             super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>).
                             _M_impl.super__Vector_impl_data._M_start)->super_HaveDefines).
                           _vptr_HaveDefines + lVar19),0x8b31);
      }
      lVar19 = lVar19 + 0x100;
    }
    std::vector<vera::Flood,_std::allocator<vera::Flood>_>::clear(this_01);
    std::vector<vera::Shader,_std::allocator<vera::Shader>_>::clear(pSVar1);
    local_5f8[0] = 0;
    while( true ) {
      iVar13 = this->m_flood_total;
      if (iVar13 <= local_5f8[0]) break;
      vera::toString<int>(&local_628,local_5f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5b8
                     ,"u_flood",&local_628);
      vVar21 = getBufferSize(local_638,(string *)&local_5b8);
      fStack_5d0 = (float)extraout_XMM0_Dc_02;
      local_5d8 = (undefined1  [8])vVar21._0_8_;
      fStack_5cc = (float)extraout_XMM0_Dd_02;
      local_608._0_4_ = vVar21.field_2;
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_628);
      vera::Shader::Shader((Shader *)&local_5b8);
      std::vector<vera::Shader,_std::allocator<vera::Shader>_>::emplace_back<vera::Shader>
                (pSVar1,(Shader *)&local_5b8);
      vera::Shader::~Shader((Shader *)&local_5b8);
      vera::Flood::Flood((Flood *)&local_5b8);
      std::vector<vera::Flood,_std::allocator<vera::Flood>_>::emplace_back<vera::Flood>
                (this_01,(Flood *)&local_5b8);
      vera::Flood::~Flood((Flood *)&local_5b8);
      pFVar9 = (this->uniforms).floods.super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (*pFVar9[local_5f8[0]].super_PingPong._vptr_PingPong[2])
                (pFVar9 + local_5f8[0],(ulong)(uint)(int)(float)local_5d8._0_4_,
                 (ulong)(uint)(int)(float)local_5d8._4_4_,2,0,0,1);
      lVar19 = (long)local_5f8[0];
      pFVar9 = (this->uniforms).floods.super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar9[lVar19].scale = (float)local_608._0_4_;
      local_628._M_string_length = 0;
      local_5b8._vptr_Pyramid = *(_func_int ***)&pFVar9[lVar19].pass.super__Function_base._M_functor
      ;
      local_5b8.pass.super__Function_base._M_functor._M_unused._0_8_ =
           (undefined8)
           *(undefined8 *)((long)&pFVar9[lVar19].pass.super__Function_base._M_functor + 8);
      *(Sandbox **)&pFVar9[lVar19].pass.super__Function_base._M_functor = this;
      *(undefined8 *)((long)&pFVar9[lVar19].pass.super__Function_base._M_functor + 8) = 0;
      local_5b8.pass.super__Function_base._M_functor._8_8_ =
           pFVar9[lVar19].pass.super__Function_base._M_manager;
      pFVar9[lVar19].pass.super__Function_base._M_manager =
           std::
           _Function_handler<void_(vera::Fbo_*,_const_vera::Fbo_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:1539:39)>
           ::_M_manager;
      local_5b8.pass.super__Function_base._M_manager = (_Manager_type)pFVar9[lVar19].pass._M_invoker
      ;
      pFVar9[lVar19].pass._M_invoker =
           std::
           _Function_handler<void_(vera::Fbo_*,_const_vera::Fbo_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:1539:39)>
           ::_M_invoke;
      local_628._M_dataplus._M_p = (pointer)this;
      std::_Function_base::~_Function_base((_Function_base *)&local_5b8);
      local_5f8[0] = local_5f8[0] + 1;
    }
  }
  if (0 < iVar13) {
    bVar12 = checkFloodAlgorithm(local_638);
    if (bVar12) {
      std::__cxx11::string::string((string *)&local_5b8,"FLOOD_ALGORITHM",(allocator *)local_5f8);
      std::__cxx11::string::string((string *)&local_628,"",(allocator *)&local_640);
      vera::HaveDefines::addDefine
                (&(this->m_flood_shader).super_HaveDefines,(string *)&local_5b8,&local_628);
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::string::~string((string *)&local_5b8);
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,_type_06);
      vera::Shader::setSource(&this->m_flood_shader,local_638,(string *)&local_5b8);
    }
    else {
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x17,_type_05);
      vera::getDefaultSrc_abi_cxx11_(&local_628,(vera *)0x5,_type_07);
      vera::Shader::setSource(&this->m_flood_shader,(string *)&local_5b8,&local_628);
      std::__cxx11::string::~string((string *)&local_628);
    }
    std::__cxx11::string::~string((string *)&local_5b8);
  }
  uVar16 = 0;
  while( true ) {
    pSVar17 = (this->m_flood_subshaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_640 = uVar16;
    if ((ulong)((long)(this->m_flood_subshaders).
                      super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pSVar17 >> 8) <= uVar16) break;
    vera::toString<unsigned_long>(&local_628,&local_640);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5b8,
                   "FLOOD_",&local_628);
    std::__cxx11::string::string((string *)local_5f8,"",&local_641);
    pSVar17 = pSVar17 + uVar16;
    (*(pSVar17->super_HaveDefines)._vptr_HaveDefines[10])(pSVar17,&local_5b8,(string *)local_5f8);
    std::__cxx11::string::~string((string *)local_5f8);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_628);
    pSVar20 = (this->m_flood_subshaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start + local_640;
    vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,_type_08);
    vera::Shader::setSource(pSVar20,local_638,(string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_5b8);
    uVar16 = local_640 + 1;
  }
  if ((this->m_postprocessing != false) || (this->m_plot - PLOT_LUMA < 5)) {
    if (this->quilt_resolution < 0) {
      iVar13 = vera::getWindowWidth();
      _height = vera::getWindowHeight();
    }
    else {
      iVar13 = vera::getQuiltWidth();
      _height = vera::getQuiltHeight();
    }
    SceneRender::updateBuffers(&this->m_sceneRender,local_630,iVar13,_height);
  }
  return;
}

Assistant:

void Sandbox::_updateBuffers() {
    // Update Buffers
    if ( m_buffers_total != int(uniforms.buffers.size())) {
        if (verbose)
            std::cout << "Creating/removing " << uniforms.buffers.size() << " buffers to match " << m_buffers_total << std::endl;

        for (size_t i = 0; i < m_buffers_shaders.size(); i++)
            if (m_buffers_shaders[i].isLoaded())
                m_buffers_shaders[i].detach(GL_FRAGMENT_SHADER | GL_VERTEX_SHADER);

        for (size_t i = 0; i < uniforms.buffers.size(); i++)
            delete uniforms.buffers[i];

        uniforms.buffers.clear();
        m_buffers_shaders.clear();

        for (int i = 0; i < m_buffers_total; i++) {
            // New FBO
            uniforms.buffers.push_back( new vera::Fbo() );
            glm::vec3 size = getBufferSize(m_frag_source, "u_buffer" + vera::toString(i));
            uniforms.buffers[i]->allocate(size.x, size.y, vera::COLOR_FLOAT_TEXTURE);
            uniforms.buffers[i]->scale = size.z;
            
            // New Shader
            m_buffers_shaders.push_back( vera::Shader() );
            m_buffers_shaders[i].addDefine("BUFFER_" + vera::toString(i));
            m_buffers_shaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        }
    }
    else
        for (size_t i = 0; i < m_buffers_shaders.size(); i++)
            m_buffers_shaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
            
    // Update Double Buffers
    if ( m_doubleBuffers_total != int(uniforms.doubleBuffers.size()) ) {

        if (verbose)
            std::cout << "Creating/removing " << uniforms.doubleBuffers.size() << " double buffers to match " << m_doubleBuffers_total << std::endl;

        for (size_t i = 0; i < m_doubleBuffers_shaders.size(); i++)
            if (m_doubleBuffers_shaders[i].isLoaded())
                m_doubleBuffers_shaders[i].detach(GL_FRAGMENT_SHADER | GL_VERTEX_SHADER);

        for (size_t i = 0; i < uniforms.doubleBuffers.size(); i++)
            delete uniforms.doubleBuffers[i];

        uniforms.doubleBuffers.clear();
        m_doubleBuffers_shaders.clear();

        for (int i = 0; i < m_doubleBuffers_total; i++) {
            // New FBO
            uniforms.doubleBuffers.push_back( new vera::PingPong() );

            glm::vec3 size = getBufferSize(m_frag_source, "u_doubleBuffer" + vera::toString(i));
            uniforms.doubleBuffers[i]->allocate(size.x, size.y, vera::COLOR_FLOAT_TEXTURE);
            uniforms.doubleBuffers[i]->buffer(0).scale = size.z;
            uniforms.doubleBuffers[i]->buffer(1).scale = size.z;
            
            // New Shader
            m_doubleBuffers_shaders.push_back( vera::Shader() );
            m_doubleBuffers_shaders[i].addDefine("DOUBLE_BUFFER_" + vera::toString(i));
            m_doubleBuffers_shaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        }
    }
    else 
        for (size_t i = 0; i < m_doubleBuffers_shaders.size(); i++)
            m_doubleBuffers_shaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));

    // Update PYRAMID buffers
    if ( m_pyramid_total != int(uniforms.pyramids.size()) ) {

        if (verbose)
            std::cout << "Removing " << uniforms.pyramids.size() << " pyramids to create  " << m_pyramid_total << std::endl;

        for (size_t i = 0; i < m_pyramid_subshaders.size(); i++)
            if (m_pyramid_subshaders[i].isLoaded())
                m_pyramid_subshaders[i].detach(GL_FRAGMENT_SHADER | GL_VERTEX_SHADER);        

        uniforms.pyramids.clear();
        m_pyramid_fbos.clear();
        m_pyramid_subshaders.clear();

        for (int i = 0; i < m_pyramid_total; i++) {
            glm::vec3 size = getBufferSize(m_frag_source, "u_pyramid" + vera::toString(i));

            // Create Subshader
            m_pyramid_subshaders.push_back( vera::Shader() );
            
            // Create Pyramid structure
            uniforms.pyramids.push_back( vera::Pyramid() );
            uniforms.pyramids[i].allocate(size.x, size.y);
            uniforms.pyramids[i].scale = size.z;

            // Create pass function for this pyramid
            uniforms.pyramids[i].pass = [this](vera::Fbo *_target, const vera::Fbo *_tex0, const vera::Fbo *_tex1, int _depth) {
                _target->bind();
                glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
                glClear(GL_COLOR_BUFFER_BIT);
                m_pyramid_shader.use();

                uniforms.feedTo( &m_pyramid_shader );

                m_pyramid_shader.setUniform("u_pyramidDepth", _depth);
                m_pyramid_shader.setUniform("u_pyramidTotalDepth", (int)uniforms.pyramids[0].getDepth());
                m_pyramid_shader.setUniform("u_pyramidUpscaling", _tex1 != NULL);

                m_pyramid_shader.textureIndex = (uniforms.models.size() == 0) ? 1 : 0;
                m_pyramid_shader.setUniformTexture("u_pyramidTex0", _tex0);
                if (_tex1 != NULL)
                    m_pyramid_shader.setUniformTexture("u_pyramidTex1", _tex1);
                m_pyramid_shader.setUniform("u_resolution", ((float)_target->getWidth()), ((float)_target->getHeight()));
                m_pyramid_shader.setUniform("u_pixel", 1.0f/((float)_target->getWidth()), 1.0f/((float)_target->getHeight()));

                vera::getBillboard()->render( &m_pyramid_shader );
                _target->unbind();
            };

            // Create input FBO
            m_pyramid_fbos.push_back( vera::Fbo() );
            m_pyramid_fbos[i].allocate(size.x, size.y, vera::COLOR_FLOAT_TEXTURE);
            m_pyramid_fbos[i].scale = size.z;
        }
    }

    // Update PYRAMID algo
    if (m_pyramid_total > 0 ) {
        if ( checkPyramidAlgorithm( getSource(FRAGMENT) ) ) {
            m_pyramid_shader.addDefine("PYRAMID_ALGORITHM");
            m_pyramid_shader.setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        }
        else
            m_pyramid_shader.setSource(vera::getDefaultSrc(vera::FRAG_POISSONFILL), vera::getDefaultSrc(vera::VERT_BILLBOARD));
    }
    
    // Update PYRAMID subshaders
    for (size_t i = 0; i < m_pyramid_subshaders.size(); i++) {
        m_pyramid_subshaders[i].addDefine("PYRAMID_" + vera::toString(i));
        m_pyramid_subshaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
    }

    // Update FLOOD Buffers
    if ( m_flood_total != int(uniforms.floods.size()) ) {

        if (verbose)
            std::cout << "Removing " << uniforms.floods.size() << " flood to create " << m_flood_total << std::endl;

        for (size_t i = 0; i < m_flood_subshaders.size(); i++)
            if (m_flood_subshaders[i].isLoaded())
                m_flood_subshaders[i].detach(GL_FRAGMENT_SHADER | GL_VERTEX_SHADER);        

        uniforms.floods.clear();
        m_flood_subshaders.clear();

        for (int i = 0; i < m_flood_total; i++) {
            glm::vec3 size = getBufferSize(m_frag_source, "u_flood" + vera::toString(i));

            // Create Subshader
            m_flood_subshaders.push_back( vera::Shader() );
            
            // Create Pyramid structure
            uniforms.floods.push_back( vera::Flood() );
            uniforms.floods[i].allocate(size.x, size.y, vera::COLOR_FLOAT_TEXTURE);
            uniforms.floods[i].scale = size.z;

            // Create pass function for this flood
            uniforms.floods[i].pass = [this](vera::Fbo *_dst, const vera::Fbo *_src, int _index) {
                _dst->bind();
                glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
                glClear(GL_COLOR_BUFFER_BIT);
                m_flood_shader.use();

                // uniforms.feedTo( &m_flood_shader, false, false );

                m_flood_shader.setUniform("u_resolution", ((float)_dst->getWidth()), ((float)_dst->getHeight()));
                m_flood_shader.setUniform("u_floodIndex",_index);
                m_flood_shader.setUniform("u_floodTotal", (int)uniforms.floods[0].getTotalIterations());

                m_flood_shader.textureIndex = (uniforms.models.size() == 0) ? 1 : 0;
                m_flood_shader.setUniformTexture("u_floodSrc", _src);

                vera::getBillboard()->render( &m_flood_shader );
                _dst->unbind();
            };
        }
    }

    if (m_flood_total > 0 ) {
        if ( checkFloodAlgorithm( getSource(FRAGMENT) ) ) {
            m_flood_shader.addDefine("FLOOD_ALGORITHM");
            m_flood_shader.setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        }
        else
            m_flood_shader.setSource(vera::getDefaultSrc(vera::FRAG_JUMPFLOOD), vera::getDefaultSrc(vera::VERT_BILLBOARD));
    }
    
    for (size_t i = 0; i < m_flood_subshaders.size(); i++) {
        m_flood_subshaders[i].addDefine("FLOOD_" + vera::toString(i));
        m_flood_subshaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
    }

    // Update Postprocessing
    if (m_postprocessing || m_plot == PLOT_RGB || m_plot == PLOT_RED || m_plot == PLOT_GREEN || m_plot == PLOT_BLUE || m_plot == PLOT_LUMA) {
        if (quilt_resolution >= 0)
            m_sceneRender.updateBuffers(uniforms, vera::getQuiltWidth(), vera::getQuiltHeight());
        else 
            m_sceneRender.updateBuffers(uniforms, vera::getWindowWidth(), vera::getWindowHeight());
    }

}